

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O0

bool __thiscall
glcts::TestCaseBase::doesProgramBuild
          (TestCaseBase *this,uint n_fs_body_parts,char **fs_body_parts,uint n_gs_body_parts,
          char **gs_body_parts,uint n_vs_body_parts,char **vs_body_parts)

{
  bool bVar1;
  int iVar2;
  GLuint sh3_shader_id;
  GLuint sh2_shader_id;
  GLuint sh1_shader_id;
  GLuint po_id;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLuint program_object_id;
  GLuint fragment_shader_id;
  GLuint geometry_shader_id;
  GLuint vertex_shader_id;
  bool result;
  Functions *gl;
  uint n_vs_body_parts_local;
  char **gs_body_parts_local;
  uint n_gs_body_parts_local;
  char **fs_body_parts_local;
  uint n_fs_body_parts_local;
  TestCaseBase *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  sh3_shader_id = (**(code **)(lVar4 + 0x3f0))(0x8b31);
  sh2_shader_id = (**(code **)(lVar4 + 0x3f0))((this->m_glExtTokens).GEOMETRY_SHADER);
  sh1_shader_id = (**(code **)(lVar4 + 0x3f0))(0x8b30);
  po_id = (**(code **)(lVar4 + 0x3c8))();
  err = (**(code **)(lVar4 + 0x800))();
  glu::checkError(err,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x30e);
  bVar1 = buildProgram(this,po_id,sh1_shader_id,n_fs_body_parts,fs_body_parts,sh2_shader_id,
                       n_gs_body_parts,gs_body_parts,sh3_shader_id,n_vs_body_parts,vs_body_parts,
                       (bool *)0x0);
  if (po_id != 0) {
    (**(code **)(lVar4 + 0x448))(po_id);
  }
  if (sh1_shader_id != 0) {
    (**(code **)(lVar4 + 0x470))(sh1_shader_id);
  }
  if (sh2_shader_id != 0) {
    (**(code **)(lVar4 + 0x470))(sh2_shader_id);
  }
  if (sh3_shader_id != 0) {
    (**(code **)(lVar4 + 0x470))(sh3_shader_id);
  }
  return bVar1;
}

Assistant:

bool TestCaseBase::doesProgramBuild(unsigned int n_fs_body_parts, const char* const* fs_body_parts,
									unsigned int n_gs_body_parts, const char* const* gs_body_parts,
									unsigned int n_vs_body_parts, const char* const* vs_body_parts)
{
	/* General variables */
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = false;

	/* Shaders */
	glw::GLuint vertex_shader_id   = 0;
	glw::GLuint geometry_shader_id = 0;
	glw::GLuint fragment_shader_id = 0;

	/* Program */
	glw::GLuint program_object_id = 0;

	/* Create shaders */
	vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);
	geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);

	/* Create program */
	program_object_id = gl.createProgram();

	/* Check createProgram call for errors */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Compile and link the program */
	result = buildProgram(program_object_id, fragment_shader_id, n_fs_body_parts, fs_body_parts, geometry_shader_id,
						  n_gs_body_parts, gs_body_parts, vertex_shader_id, n_vs_body_parts, vs_body_parts);

	if (program_object_id != 0)
		gl.deleteProgram(program_object_id);
	if (fragment_shader_id != 0)
		gl.deleteShader(fragment_shader_id);
	if (geometry_shader_id != 0)
		gl.deleteShader(geometry_shader_id);
	if (vertex_shader_id != 0)
		gl.deleteShader(vertex_shader_id);

	return result;
}